

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

int __thiscall
cmsys::SystemInformationImplementation::GetFullyQualifiedDomainName
          (SystemInformationImplementation *this,string *fqdn)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  socklen_t __salen;
  uint uVar7;
  long *plVar8;
  string candidate;
  ifaddrs *ifas;
  char base [1025];
  char host [1025];
  long *local_878;
  ulong local_870;
  long local_868 [2];
  size_t local_858;
  long local_850;
  char local_848 [1040];
  char local_438 [1032];
  
  std::__cxx11::string::_M_replace((ulong)fqdn,0,(char *)fqdn->_M_string_length,0x5934f0);
  iVar2 = gethostname(local_848,0x401);
  iVar3 = -1;
  if (iVar2 == 0) {
    sVar4 = strlen(local_848);
    pcVar1 = (char *)fqdn->_M_string_length;
    strlen(local_848);
    std::__cxx11::string::_M_replace((ulong)fqdn,0,pcVar1,(ulong)local_848);
    plVar8 = &local_850;
    iVar2 = getifaddrs(plVar8);
    iVar3 = -2;
    if (iVar2 == 0) {
      iVar3 = 0;
      local_858 = sVar4;
      do {
        plVar8 = (long *)*plVar8;
        if (plVar8 == (long *)0x0) break;
        if ((ushort *)plVar8[3] == (ushort *)0x0) {
          uVar7 = 0xffffffff;
        }
        else {
          uVar7 = (uint)*(ushort *)plVar8[3];
        }
        if (((uVar7 | 8) == 10) && ((*(byte *)(plVar8 + 2) & 8) == 0)) {
          bVar6 = false;
          memset(local_438,0,0x401);
          __salen = 0x1c;
          if (uVar7 == 2) {
            __salen = 0x10;
          }
          iVar3 = getnameinfo((sockaddr *)plVar8[3],__salen,local_438,0x401,(char *)0x0,0,8);
          if (iVar3 == 0) {
            local_878 = local_868;
            sVar4 = strlen(local_438);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_878,local_438,local_438 + sVar4);
            strlen(local_848);
            lVar5 = std::__cxx11::string::find((char *)&local_878,(ulong)local_848,0);
            bVar6 = local_858 < local_870 && lVar5 != -1;
            if (local_858 < local_870 && lVar5 != -1) {
              std::__cxx11::string::_M_assign((string *)fqdn);
            }
            if (local_878 != local_868) {
              operator_delete(local_878,local_868[0] + 1);
            }
            iVar3 = 0;
          }
          else {
            iVar3 = -3;
          }
        }
        else {
          bVar6 = false;
        }
      } while (!bVar6);
      freeifaddrs(local_850);
    }
  }
  return iVar3;
}

Assistant:

int SystemInformationImplementation::GetFullyQualifiedDomainName(
  std::string& fqdn)
{
  // in the event of absolute failure return localhost.
  fqdn = "localhost";

#if defined(_WIN32)
  int ierr;
  // TODO - a more robust implementation for windows, see comments
  // in unix implementation.
  WSADATA wsaData;
  WORD ver = MAKEWORD(2, 0);
  ierr = WSAStartup(ver, &wsaData);
  if (ierr) {
    return -1;
  }

  char base[256] = { '\0' };
  ierr = gethostname(base, 256);
  if (ierr) {
    WSACleanup();
    return -2;
  }
  fqdn = base;

  HOSTENT* hent = gethostbyname(base);
  if (hent) {
    fqdn = hent->h_name;
  }

  WSACleanup();
  return 0;

#elif defined(KWSYS_SYSTEMINFORMATION_IMPLEMENT_FQDN)
  // gethostname typical returns an alias for loopback interface
  // we want the fully qualified domain name. Because there are
  // any number of interfaces on this system we look for the
  // first of these that contains the name returned by gethostname
  // and is longer. failing that we return gethostname and indicate
  // with a failure code. Return of a failure code is not necessarilly
  // an indication of an error. for instance gethostname may return
  // the fully qualified domain name, or there may not be one if the
  // system lives on a private network such as in the case of a cluster
  // node.

  int ierr = 0;
  char base[NI_MAXHOST];
  ierr = gethostname(base, NI_MAXHOST);
  if (ierr) {
    return -1;
  }
  size_t baseSize = strlen(base);
  fqdn = base;

  struct ifaddrs* ifas;
  struct ifaddrs* ifa;
  ierr = getifaddrs(&ifas);
  if (ierr) {
    return -2;
  }

  for (ifa = ifas; ifa != NULL; ifa = ifa->ifa_next) {
    int fam = ifa->ifa_addr ? ifa->ifa_addr->sa_family : -1;
    // Skip Loopback interfaces
    if (((fam == AF_INET) || (fam == AF_INET6)) &&
        !(ifa->ifa_flags & IFF_LOOPBACK)) {
      char host[NI_MAXHOST] = { '\0' };

      const size_t addrlen = (fam == AF_INET ? sizeof(struct sockaddr_in)
                                             : sizeof(struct sockaddr_in6));

      ierr = getnameinfo(ifa->ifa_addr, static_cast<socklen_t>(addrlen), host,
                         NI_MAXHOST, NULL, 0, NI_NAMEREQD);
      if (ierr) {
        // don't report the failure now since we may succeed on another
        // interface. If all attempts fail then return the failure code.
        ierr = -3;
        continue;
      }

      std::string candidate = host;
      if ((candidate.find(base) != std::string::npos) &&
          baseSize < candidate.size()) {
        // success, stop now.
        ierr = 0;
        fqdn = candidate;
        break;
      }
    }
  }
  freeifaddrs(ifas);

  return ierr;
#else
  /* TODO: Implement on more platforms.  */
  fqdn = this->GetHostname();
  return -1;
#endif
}